

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryPropertyExprSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::PropertyExprSyntax&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,SyntaxKind *args,PropertyExprSyntax *args_1,Token *args_2,
          PropertyExprSyntax *args_3)

{
  Token op;
  BinaryPropertyExprSyntax *pBVar1;
  BinaryPropertyExprSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  BumpAllocator *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pBVar1 = (BinaryPropertyExprSyntax *)
           allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  op.info = in_RSI;
  op.kind = (short)in_RDX;
  op._2_1_ = (char)((ulong)in_RDX >> 0x10);
  op.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  op.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::BinaryPropertyExprSyntax::BinaryPropertyExprSyntax
            (in_RCX,(SyntaxKind)((ulong)in_R8 >> 0x20),
             (PropertyExprSyntax *)(in_RCX->super_PropertyExprSyntax).super_SyntaxNode.parent,op,
             *(PropertyExprSyntax **)&(in_RCX->super_PropertyExprSyntax).super_SyntaxNode);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }